

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

void __thiscall chrono::fea::ChElementShellANCF_3443::GetDensity(ChElementShellANCF_3443 *this)

{
  GetDensity((ChElementShellANCF_3443 *)&this[-1].m_K3Compact);
  return;
}

Assistant:

double ChElementShellANCF_3443::GetDensity() {
    double tot_density = 0;
    for (int kl = 0; kl < m_numLayers; kl++) {
        double rho = m_layers[kl].GetMaterial()->Get_rho();
        double layerthick = m_layers[kl].Get_thickness();
        tot_density += rho * layerthick;
    }
    return tot_density / m_thicknessZ;
}